

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundatanode_inmem.c
# Opt level: O2

SUNErrCode
SUNDataNode_CreateList_InMem
          (sundataindex init_size,SUNContext_conflict sunctx,SUNDataNode *node_out)

{
  SUNDataNode pSVar1;
  undefined8 *puVar2;
  void *pvVar3;
  SUNDataNode node;
  
  pSVar1 = sunDataNode_CreateCommon_InMem(sunctx);
  pSVar1->dtype = SUNDATANODE_LIST;
  node = pSVar1;
  if ((-1 < init_size) && (puVar2 = (undefined8 *)malloc(0x20), puVar2 != (undefined8 *)0x0)) {
    pvVar3 = malloc(init_size * 8);
    puVar2[2] = pvVar3;
    if (pvVar3 != (void *)0x0) {
      *puVar2 = 0;
      puVar2[1] = init_size;
      puVar2[3] = sunDataNode_FreeValue_InMem;
      *(undefined8 **)((long)pSVar1->content + 0x30) = puVar2;
      *node_out = pSVar1;
      return 0;
    }
  }
  *(undefined8 *)((long)pSVar1->content + 0x30) = 0;
  sunDataNode_DestroyCommon_InMem(&node);
  return -0x2705;
}

Assistant:

SUNErrCode SUNDataNode_CreateList_InMem(sundataindex init_size,
                                        SUNContext sunctx, SUNDataNode* node_out)
{
  SUNFunctionBegin(sunctx);

  SUNDataNode node = sunDataNode_CreateCommon_InMem(sunctx);

  BASE_MEMBER(node, dtype) = SUNDATANODE_LIST;
  IMPL_MEMBER(node, anon_children) =
    SUNStlVector_SUNDataNode_New(init_size, sunDataNode_FreeValue_InMem);
  if (IMPL_MEMBER(node, anon_children) == NULL)
  {
    sunDataNode_DestroyCommon_InMem(&node);
    return SUN_ERR_MEM_FAIL;
  }

  *node_out = node;
  return SUN_SUCCESS;
}